

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O2

Compressed_lower_distance_matrix *
read_distance_matrix(Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  istream *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  string line;
  istringstream s;
  
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  iVar3 = 0;
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>
      ::Compressed_distance_matrix(__return_storage_ptr__,&distances);
      std::__cxx11::string::~string((string *)&line);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&distances.super__Vector_base<float,_std::allocator<float>_>);
      return __return_storage_ptr__;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)&line,_S_in);
    iVar2 = iVar3;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      piVar1 = std::istream::_M_extract<float>((float *)&s);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<float,_std::allocator<float>_>::push_back(&distances,&value);
      std::istream::ignore();
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

Compressed_lower_distance_matrix read_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;

  std::string line;
  value_t value;
  for (int i = 0; std::getline(input_stream, line); ++i) {
    std::istringstream s(line);
    for (int j = 0; j < i && s >> value; ++j) {
      distances.push_back(value);
      s.ignore();
    }
  }

  return Compressed_lower_distance_matrix(std::move(distances));
}